

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O2

int IDASetLinearSolverB(void *ida_mem,int which,SUNLinearSolver LS,SUNMatrix A)

{
  int iVar1;
  void *__ptr;
  int error_code;
  char *msgfmt;
  int *piVar2;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    iVar1 = 0x711;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAAdjInit.";
    error_code = -0x65;
    iVar1 = 0x71a;
  }
  else if (which < *(int *)(*(long *)((long)ida_mem + 0x840) + 0x38)) {
    for (piVar2 = (int *)(*(long *)((long)ida_mem + 0x840) + 0x30);
        (piVar2 = *(int **)piVar2, piVar2 != (int *)0x0 && (*piVar2 != which));
        piVar2 = piVar2 + 0x20) {
    }
    __ptr = calloc(1,0x58);
    if (__ptr != (void *)0x0) {
      if (*(code **)(piVar2 + 0x14) != (code *)0x0) {
        (**(code **)(piVar2 + 0x14))(piVar2);
      }
      *(void **)(piVar2 + 0x12) = __ptr;
      *(code **)(piVar2 + 0x14) = idaLsFreeB;
      iVar1 = IDASetLinearSolver(*(void **)(piVar2 + 4),LS,A);
      if (iVar1 != 0) {
        free(__ptr);
        return iVar1;
      }
      return 0;
    }
    msgfmt = "A memory request failed.";
    error_code = -4;
    iVar1 = 0x735;
  }
  else {
    msgfmt = "Illegal value for which.";
    error_code = -3;
    iVar1 = 0x723;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar1,"IDASetLinearSolverB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetLinearSolverB(void* ida_mem, int which, SUNLinearSolver LS, SUNMatrix A)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  void* ida_memB;
  int retval;

  /* Check if ida_mem exists */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Was ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDALS_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_WHICH);
    return (IDALS_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    IDAB_mem = IDAB_mem->ida_next;
  }

  /* Get memory for IDALsMemRecB */
  idalsB_mem = NULL;
  idalsB_mem = (IDALsMemB)malloc(sizeof(struct IDALsMemRecB));
  if (idalsB_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* initialize Jacobian and preconditioner functions */
  idalsB_mem->jacB      = NULL;
  idalsB_mem->jacBS     = NULL;
  idalsB_mem->jtsetupB  = NULL;
  idalsB_mem->jtsetupBS = NULL;
  idalsB_mem->jtimesB   = NULL;
  idalsB_mem->jtimesBS  = NULL;
  idalsB_mem->psetB     = NULL;
  idalsB_mem->psetBS    = NULL;
  idalsB_mem->psolveB   = NULL;
  idalsB_mem->psolveBS  = NULL;
  idalsB_mem->P_dataB   = NULL;

  /* free any existing system solver attached to IDAB */
  if (IDAB_mem->ida_lfree) { IDAB_mem->ida_lfree(IDAB_mem); }

  /* Attach lmemB data and lfreeB function. */
  IDAB_mem->ida_lmem  = idalsB_mem;
  IDAB_mem->ida_lfree = idaLsFreeB;

  /* set the linear solver for this backward problem */
  ida_memB = (void*)IDAB_mem->IDA_mem;
  retval   = IDASetLinearSolver(ida_memB, LS, A);
  if (retval != IDALS_SUCCESS)
  {
    free(idalsB_mem);
    idalsB_mem = NULL;
  }

  return (retval);
}